

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.h
# Opt level: O0

t_type xemmai::t_type_of<double>::t_cast<double>::f_as<xemmai::t_value<xemmai::t_pointer>&>
                 (t_value<xemmai::t_pointer> *a_object)

{
  t_object *this;
  intptr_t iVar1;
  double *pdVar2;
  t_object *p;
  t_value<xemmai::t_pointer> *a_object_local;
  
  this = t_pointer::operator_cast_to_t_object_(&a_object->super_t_pointer);
  if (this == (t_object *)0x3) {
    iVar1 = t_value<xemmai::t_pointer>::f_integer(a_object);
    a_object_local = (t_value<xemmai::t_pointer> *)(double)iVar1;
  }
  else if (this == (t_object *)0x4) {
    a_object_local = (t_value<xemmai::t_pointer> *)t_value<xemmai::t_pointer>::f_float(a_object);
  }
  else {
    pdVar2 = t_object::f_as<double>(this);
    a_object_local = (t_value<xemmai::t_pointer> *)*pdVar2;
  }
  return (t_type)a_object_local;
}

Assistant:

static t_type f_as(auto&& a_object)
		{
			auto p = static_cast<t_object*>(a_object);
			switch (reinterpret_cast<uintptr_t>(p)) {
			case c_tag__INTEGER:
				return a_object.f_integer();
			case c_tag__FLOAT:
				return a_object.f_float();
			default:
				return p->f_as<double>();
			}
		}